

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# njd_node.c
# Opt level: O2

char get_token_from_string(char *str,int *index,char *buff)

{
  int iVar1;
  byte bVar2;
  ulong uVar3;
  long lVar4;
  
  lVar4 = (long)*index;
  bVar2 = str[lVar4];
  if (bVar2 == 0) {
    bVar2 = 0;
    uVar3 = 0;
  }
  else {
    uVar3 = 0;
    while ((0x1b < bVar2 - 0x25 || ((0x8000401U >> (bVar2 - 0x25 & 0x1f) & 1) == 0))) {
      if (bVar2 == 0) goto LAB_0017337b;
      buff[uVar3] = bVar2;
      uVar3 = uVar3 + 1;
      iVar1 = *index;
      lVar4 = (long)iVar1 + 1;
      *index = (int)lVar4;
      bVar2 = str[(long)iVar1 + 1];
    }
    *index = (int)lVar4 + 1;
  }
LAB_0017337b:
  buff[uVar3 & 0xffffffff] = '\0';
  return bVar2;
}

Assistant:

static void get_token_from_string(const char *str, int *index, char *buff, char d)
{
   char c;
   int i = 0;

   c = str[(*index)];
   if (c != '\0') {
      while (c != d && c != '\0') {
         buff[i++] = c;
         c = str[++(*index)];
      }
      if (c == d)
         (*index)++;
   }
   buff[i] = '\0';
}